

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O1

void __thiscall SocketPP::TCPServer::onDisconnected(TCPServer *this,int fd)

{
  pointer pTVar1;
  int iVar2;
  pointer pTVar3;
  long lVar4;
  pointer pTVar5;
  TCPStream local_1c;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->streamMutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pTVar5 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pTVar1 - (long)pTVar5 >> 4;
  pTVar3 = pTVar5;
  if (0 < lVar4) {
    pTVar3 = (pointer)((long)&pTVar5->fd + ((long)pTVar1 - (long)pTVar5 & 0xfffffffffffffff0U));
    lVar4 = lVar4 + 1;
    pTVar5 = pTVar5 + 2;
    do {
      if (pTVar5[-2].fd == fd) {
        pTVar5 = pTVar5 + -2;
        goto LAB_00105041;
      }
      if (pTVar5[-1].fd == fd) {
        pTVar5 = pTVar5 + -1;
        goto LAB_00105041;
      }
      if (pTVar5->fd == fd) goto LAB_00105041;
      if (pTVar5[1].fd == fd) {
        pTVar5 = pTVar5 + 1;
        goto LAB_00105041;
      }
      lVar4 = lVar4 + -1;
      pTVar5 = pTVar5 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)pTVar1 - (long)pTVar3 >> 2;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pTVar5 = pTVar1;
      if ((lVar4 != 3) || (pTVar5 = pTVar3, pTVar3->fd == fd)) goto LAB_00105041;
      pTVar3 = pTVar3 + 1;
    }
    pTVar5 = pTVar3;
    if (pTVar3->fd == fd) goto LAB_00105041;
    pTVar3 = pTVar3 + 1;
  }
  pTVar5 = pTVar3;
  if (pTVar3->fd != fd) {
    pTVar5 = pTVar1;
  }
LAB_00105041:
  if (pTVar5 == pTVar1) {
    printf("\x1b[31mERROR: %s: %s: %d: fd:%d is not in connectedStreams_!\x1b[m\n","TCPServer.cpp",
           "onDisconnected",0xa6,fd);
  }
  else {
    pTVar3 = pTVar5 + 1;
    if (pTVar3 != pTVar1) {
      memmove(pTVar5,pTVar3,(long)pTVar1 - (long)pTVar3);
    }
    pTVar5 = (this->connectedStreams_).
             super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    (this->connectedStreams_).
    super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar5;
    printf("\x1b[33m%s: connectedStreams_.size()=%ld\x1b[m\n","TCPServer.cpp",
           (long)pTVar5 -
           (long)(this->connectedStreams_).
                 super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
    if ((this->discHandle_).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_1c.fd = fd;
      (*(this->discHandle_)._M_invoker)((_Any_data *)&this->discHandle_,&local_1c);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
  return;
}

Assistant:

void TCPServer::onDisconnected(int fd) {
    std::lock_guard<std::mutex> lockStream(streamMutex_);
    auto iter = std::find_if(connectedStreams_.cbegin(), connectedStreams_.cend(),
                             [&](TCPStream stream) { return stream.fd == fd; });

    if (iter == connectedStreams_.cend()) {
        LOGE("fd:%d is not in connectedStreams_!", fd);
        return;
    }

    connectedStreams_.erase(iter);

    LOGD("connectedStreams_.size()=%ld", connectedStreams_.size());

    if (discHandle_)
        discHandle_(fd);
}